

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * cargo_get_usage(cargo_t ctx,cargo_usage_t flags)

{
  size_t *psVar1;
  cargo_group_t *grp;
  size_t sVar2;
  cargo_opt_t *pcVar3;
  cargo_group_t *pcVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  int iVar12;
  undefined8 uVar13;
  char cVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  long lVar20;
  bool bVar21;
  cargo_t pcVar22;
  long lVar23;
  char *opt_s;
  cargo_astr_t str;
  char *b;
  size_t local_68;
  char *b_1;
  cargo_astr_t local_58;
  
  b = (char *)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x15da,"const char *cargo_get_usage(cargo_t, cargo_usage_t)");
  }
  if ((flags & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL) {
    b_1 = (char *)0x0;
    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);
    local_58.l = 0;
    local_58.offset = 0;
    local_58.diff = 0;
    pcVar10 = ctx->progname;
    pcVar22 = ctx;
    local_58.s = &b_1;
    if ((flags >> 8 & 1) == 0) {
      pcVar9 = strrchr(pcVar10,0x2f);
      if ((pcVar9 == (char *)0x0) && (pcVar9 = strrchr(pcVar10,0x5c), pcVar9 == (char *)0x0)) {
        pcVar9 = pcVar10;
      }
      sVar8 = strspn(pcVar9,"/\\");
      pcVar10 = pcVar9 + sVar8;
    }
    cargo_aappendf(&local_58,"Usage: %s",pcVar10);
    if (-1 < (char)flags) {
      local_68 = local_58.offset;
      _cargo_get_short_option_usages(ctx,&local_58,local_58.offset,0);
      opt_s = (char *)0x0;
      if (ctx->mutex_group_count != 0) {
        uVar16 = 0;
        sVar19 = 0;
        do {
          pcVar4 = ctx->mutex_groups;
          if ((pcVar4[uVar16].flags & 0x30) == 0) {
            if (pcVar4[uVar16].metavar == (char *)0x0) {
              if (((pcVar4[uVar16].flags & 4) == 0) &&
                 (uVar15 = pcVar4[uVar16].opt_count, uVar15 != 0)) {
                uVar17 = 0;
                do {
                  sVar5 = pcVar4[uVar16].flags;
                  str.l = 0;
                  str.offset = 0;
                  str.diff = 0;
                  str.s = &opt_s;
                  sVar2 = pcVar4[uVar16].option_indices[uVar17];
                  pcVar3 = ctx->options;
                  if (uVar17 == 0) {
                    pcVar10 = " {";
                    if ((sVar5 & 1) == 0) {
                      pcVar10 = " [";
                    }
                    cargo_aappendf(&str,"%s",pcVar10);
                  }
                  iVar7 = _cargo_get_short_option_usage
                                    (ctx,pcVar3 + sVar2,&str,pcVar3[sVar2].positional,0);
                  if (iVar7 < 0) goto LAB_0010cd6c;
                  if (uVar17 == uVar15 - 1) {
                    pcVar10 = "}";
                    if ((sVar5 & 1) == 0) {
                      pcVar10 = "]";
                    }
                    cargo_aappendf(&str,"%s",pcVar10);
                    ctx = pcVar22;
                  }
                  else {
                    cargo_aappendf(&str,", ");
                    ctx = pcVar22;
                  }
                  sVar2 = local_58.offset;
                  if (ctx->max_width <= (local_58.offset - sVar19) + str.offset) {
                    cargo_aappendf(&local_58,"\n%*s",local_68," ");
                    sVar19 = sVar2;
                  }
                  pcVar22 = ctx;
                  if ((opt_s != (char *)0x0) &&
                     (cargo_aappendf(&local_58,"%s"), opt_s != (char *)0x0)) {
                    if (replaced_cargo_free == (cargo_free_f)0x0) {
                      free(opt_s);
                    }
                    else {
                      (*replaced_cargo_free)(opt_s);
                    }
                    opt_s = (char *)0x0;
                  }
                  uVar17 = uVar17 + 1;
                  uVar15 = pcVar4[uVar16].opt_count;
                } while (uVar17 < uVar15);
              }
            }
            else {
              str.l = 0;
              str.offset = 0;
              str.diff = 0;
              str.s = &opt_s;
              cargo_aappendf(&str," %s",pcVar4[uVar16].metavar);
              sVar2 = local_58.offset;
              psVar1 = &ctx->max_width;
              ctx = pcVar22;
              if (*psVar1 <= (local_58.offset - sVar19) + str.offset) {
                cargo_aappendf(&local_58,"\n%*s",local_68," ");
                sVar19 = sVar2;
                ctx = pcVar22;
              }
              pcVar22 = ctx;
              if ((opt_s != (char *)0x0) &&
                 (cargo_aappendf(&local_58,"%s"), pcVar22 = ctx, opt_s != (char *)0x0)) {
                if (replaced_cargo_free == (cargo_free_f)0x0) {
                  free(opt_s);
                }
                else {
                  (*replaced_cargo_free)(opt_s);
                }
                opt_s = (char *)0x0;
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < ctx->mutex_group_count);
      }
LAB_0010cd6c:
      _cargo_get_short_option_usages(ctx,&local_58,local_68,1);
    }
    if (replaced_cargo_realloc == (cargo_realloc_f)0x0) {
      b_1 = (char *)realloc(b_1,local_58.offset + 1);
    }
    else {
      b_1 = (char *)(*replaced_cargo_realloc)(b_1,local_58.offset + 1);
    }
    if (b_1 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = ctx->short_usage;
      if (pcVar10 != (char *)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(pcVar10);
        }
        else {
          (*replaced_cargo_free)(pcVar10);
        }
        ctx->short_usage = (char *)0x0;
      }
      ctx->short_usage = b_1;
      pcVar10 = b_1;
    }
    if (pcVar10 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar10 = (char *)0x0;
  }
  if ((flags & CARGO_USAGE_SHORT) != CARGO_USAGE_FULL) {
    return pcVar10;
  }
  sVar8 = ctx->max_width;
  if (sVar8 == 0) {
    pcVar9 = (char *)0x0;
  }
  else if (replaced_cargo_malloc == (cargo_malloc_f)0x0) {
    pcVar9 = (char *)malloc(sVar8);
  }
  else {
    pcVar9 = (char *)(*replaced_cargo_malloc)(sVar8);
  }
  if (pcVar9 == (char *)0x0) {
    iVar7 = -1;
    lVar23 = 0;
    lVar20 = 0;
  }
  else {
    if (ctx->opt_count == 0) {
      iVar7 = 0;
      lVar23 = 0;
      lVar20 = 0;
    }
    else {
      lVar18 = 0;
      lVar23 = 0;
      lVar20 = 0;
      iVar7 = 0;
      uVar16 = 0;
      do {
        pcVar3 = ctx->options;
        if ((*(byte *)((long)&pcVar3->flags + lVar18) & 0x20) == 0) {
          bVar21 = *(int *)((long)pcVar3->mutex_group_idxs + lVar18 + -0x18) == 0;
          lVar23 = lVar23 + (ulong)!bVar21;
          lVar20 = lVar20 + (ulong)bVar21;
          iVar6 = _cargo_get_option_name_str
                            (ctx,(cargo_opt_t *)((long)pcVar3->name + lVar18),pcVar9,ctx->max_width)
          ;
          if (iVar6 < 0) {
            iVar7 = -1;
            break;
          }
          iVar12 = iVar7;
          if (iVar7 < iVar6) {
            iVar12 = iVar6;
          }
          if (iVar6 < 0x29) {
            iVar7 = iVar12;
          }
        }
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0x128;
      } while (uVar16 < ctx->opt_count);
    }
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar9);
    }
    else {
      (*replaced_cargo_free)(pcVar9);
    }
  }
  if (iVar7 < 0) goto LAB_0010d29c;
  str.s = &b;
  str.l = 0x400;
  str.offset = 0;
  bVar11 = pcVar10 == (char *)0x0 | (byte)((flags & CARGO_USAGE_HIDE_SHORT) >> 6);
  uVar13 = CONCAT71((int7)((ulong)str.s >> 8),bVar11);
  if (bVar11 == 0) {
    cargo_aappendf(&str,"%s\n",pcVar10);
  }
  pcVar22 = (cargo_t)ctx->description;
  if (((pcVar22 != (cargo_t)0x0) && ((flags & CARGO_USAGE_HIDE_DESCRIPTION) == CARGO_USAGE_FULL)) &&
     (*(char *)&pcVar22->progname != '\0')) {
    if ((flags & CARGO_USAGE_RAW_DESCRIPTION) != CARGO_USAGE_FULL) {
      pcVar10 = (char *)0x0;
      iVar6 = cargo_aappendf(&str,"\n%s\n");
      if (iVar6 < 0) goto LAB_0010d2d1;
      goto LAB_0010cfe5;
    }
    pcVar10 = _cargo_linebreak(pcVar22,(char *)ctx->max_width,(size_t)pcVar22);
    if (pcVar10 != (char *)0x0) {
      cargo_aappendf(&str,"\n%s\n",pcVar10);
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar10);
      }
      else {
        (*replaced_cargo_free)(pcVar10);
      }
      if (pcVar10 != (char *)0x0) goto LAB_0010cfe5;
    }
    goto LAB_0010d29c;
  }
LAB_0010cfe5:
  if (ctx->mutex_group_count != 0) {
    pcVar10 = (char *)0x0;
    uVar16 = 0;
    do {
      pcVar4 = ctx->mutex_groups;
      cVar14 = '\x05';
      if ((*(byte *)((long)&pcVar4->flags + (long)pcVar10) & 2) != 0) {
        if (*(long *)((long)&pcVar4->title + (long)pcVar10) != 0) {
          cargo_aappendf(&str,"\n%s:\n");
        }
        iVar6 = _cargo_get_group_description
                          (ctx,&str,(cargo_group_t *)(pcVar10 + (long)pcVar4),(int)uVar13);
        cVar14 = '\x02';
        if (iVar6 == 0) {
          uVar13 = 1;
          iVar6 = _cargo_print_options
                            (ctx,*(size_t **)((long)&pcVar4->option_indices + (long)pcVar10),
                             *(size_t *)((long)&pcVar4->opt_count + (long)pcVar10),1,&str,iVar7,1,
                             flags,(cargo_usage_t)lVar23);
          if (iVar6 == 0) {
            uVar13 = 0;
            iVar6 = _cargo_print_options
                              (ctx,*(size_t **)((long)&pcVar4->option_indices + (long)pcVar10),
                               *(size_t *)((long)&pcVar4->opt_count + (long)pcVar10),0,&str,iVar7,1,
                               flags,(cargo_usage_t)lVar23);
            cVar14 = (iVar6 != 0) * '\x02';
          }
        }
      }
      if ((cVar14 != '\0') && (cVar14 != '\x05')) {
        if (cVar14 != '\x02') {
          return pcVar10;
        }
        goto LAB_0010d29c;
      }
      uVar16 = uVar16 + 1;
      pcVar10 = pcVar10 + 0x48;
    } while (uVar16 < ctx->mutex_group_count);
  }
  if (ctx->group_count != 0) {
    lVar18 = 0;
    uVar16 = 0;
    do {
      pcVar4 = ctx->groups;
      if (((*(byte *)((long)&pcVar4->flags + lVar18) & 1) == 0) &&
         (*(long *)((long)&pcVar4->opt_count + lVar18) != 0)) {
        grp = (cargo_group_t *)((long)&pcVar4->name + lVar18);
        cVar14 = *grp->name;
        if (cVar14 != '\0') {
          cargo_aappendf(&str,"\n%s:",*(undefined8 *)((long)&pcVar4->title + lVar18));
        }
        if (*(long *)((long)&pcVar4->description + lVar18) != 0) {
          cargo_aappendf(&str,"\n");
        }
        iVar6 = _cargo_get_group_description(ctx,&str,grp,(int)uVar13);
        if (iVar6 != 0) goto LAB_0010d29c;
        if (lVar23 != 0) {
          if ((cVar14 == '\0') &&
             (iVar6 = cargo_aappendf(&str,"Positional arguments:\n"), iVar6 < 0)) goto LAB_0010d29c;
          uVar13 = 1;
          iVar6 = _cargo_print_options
                            (ctx,*(size_t **)((long)&pcVar4->option_indices + lVar18),
                             *(size_t *)((long)&pcVar4->opt_count + lVar18),1,&str,iVar7,0,flags,
                             (cargo_usage_t)lVar23);
          if (iVar6 != 0) goto LAB_0010d29c;
        }
        iVar6 = cargo_aappendf(&str,"\n");
        if (iVar6 < 0) goto LAB_0010d29c;
        if (lVar20 != 0) {
          if ((cVar14 == '\0') && (iVar6 = cargo_aappendf(&str,"Options:\n"), iVar6 < 0))
          goto LAB_0010d29c;
          uVar13 = 0;
          iVar6 = _cargo_print_options
                            (ctx,*(size_t **)((long)&pcVar4->option_indices + lVar18),
                             *(size_t *)((long)&pcVar4->opt_count + lVar18),0,&str,iVar7,0,flags,
                             (cargo_usage_t)lVar23);
          if (iVar6 != 0) goto LAB_0010d29c;
        }
      }
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x48;
    } while (uVar16 < ctx->group_count);
  }
  pcVar22 = (cargo_t)ctx->epilog;
  if (((pcVar22 != (cargo_t)0x0) && ((flags & CARGO_USAGE_HIDE_EPILOG) == CARGO_USAGE_FULL)) &&
     (*(char *)&pcVar22->progname != '\0')) {
    if ((flags & CARGO_USAGE_RAW_EPILOG) == CARGO_USAGE_FULL) {
      pcVar10 = _cargo_linebreak(pcVar22,(char *)ctx->max_width,(size_t)pcVar22);
      if (pcVar10 != (char *)0x0) {
        cargo_aappendf(&str,"\n%s\n",pcVar10);
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(pcVar10);
        }
        else {
          (*replaced_cargo_free)(pcVar10);
        }
        if (pcVar10 != (char *)0x0) goto LAB_0010d2cc;
      }
LAB_0010d29c:
      pcVar10 = (char *)0x0;
      goto LAB_0010d2d1;
    }
    pcVar10 = (char *)0x0;
    iVar7 = cargo_aappendf(&str,"\n%s\n");
    if (iVar7 < 0) goto LAB_0010d2d1;
  }
LAB_0010d2cc:
  pcVar10 = b;
LAB_0010d2d1:
  if ((pcVar10 == (char *)0x0) && (b != (char *)0x0)) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(b);
    }
    else {
      (*replaced_cargo_free)(b);
    }
    b = (char *)0x0;
  }
  pcVar9 = ctx->usage;
  if (pcVar9 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar9);
    }
    else {
      (*replaced_cargo_free)(pcVar9);
    }
    ctx->usage = (char *)0x0;
  }
  ctx->usage = pcVar10;
  return pcVar10;
}

Assistant:

const char *cargo_get_usage(cargo_t ctx, cargo_usage_t flags)
{
    char *ret = NULL;
    size_t i;
    char *b = NULL;
    int max_name_len = 0;
    size_t positional_count = 0;
    size_t option_count = 0;
    const char *short_usage = NULL;
    cargo_group_t *grp = NULL;
    cargo_astr_t str;
    int is_default_group = 1;
    assert(ctx);

    if (!(flags & CARGO_USAGE_HIDE_SHORT))
    {
        if (!(short_usage = _cargo_get_short_usage(ctx, flags)))
        {
            CARGODBG(1, "Failed to get short usage\n");
            return NULL;
        }
    }

    // Only show short usage.
    if (flags & CARGO_USAGE_SHORT)
    {
        return short_usage;
    }

    // TODO: Instead of looping over all options at this stage, save the length
    // of all options on add_option, including max_length, positional_count and
    // so on.

    // First get option names and their length.
    // We get the widest one so we know the column width to use
    // for the final result.
    //   --option_a         Some description.
    //   --longer_option_b  Another description...
    // ^-------------------^
    // What should the above width be.
    if ((max_name_len = _cargo_get_max_name_length(ctx,
                        &positional_count, &option_count)) < 0)
    {
        CARGODBG(1, "Failed to get option name max length\n");
        goto fail;
    }

    str.s = &b;
    str.l = 1024;
    str.offset = 0;

    // TODO: Break all this into separate functions.

    if (short_usage && !(flags & CARGO_USAGE_HIDE_SHORT))
    {
        cargo_aappendf(&str, "%s\n", short_usage);
    }

    if(ctx->description && strlen(ctx->description)
       && !(flags & CARGO_USAGE_HIDE_DESCRIPTION))
    {
        if (flags & CARGO_USAGE_RAW_DESCRIPTION)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->description) < 0) goto fail;
        }
        else
        {
            char *lb_desc;
            if (!(lb_desc = _cargo_linebreak(ctx, ctx->description, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_desc);
            _cargo_free(lb_desc);
        }
    }

    CARGODBG(2, "max_name_len = %d, ctx->max_width = %lu\n",
            max_name_len, ctx->max_width);

    #ifdef CARGO_DEBUG
    for (i = 0; i < ctx->group_count; i++)
    {
        CARGODBG(2, "%s: %lu\n",
            ctx->groups[i].name, ctx->groups[i].opt_count);
    }
    #endif

    // Start by printing mutually exclusive groups
    for (i = 0; i < ctx->mutex_group_count; i++)
    {
        int indent = 2;
        const char *description = NULL;
        grp = &ctx->mutex_groups[i];

        if (!(grp->flags & CARGO_MUTEXGRP_GROUP_USAGE))
        {
            continue;
        }

        if (grp->title)
        {
            cargo_aappendf(&str, "\n%s:\n", grp->title);
        }

        description = grp->description;

        if (!description)
        {
            description = "Specify one of the following.";
        }

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Positional.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                1, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }

        // Options.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                0, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }
    }

    for (i = 0; i < ctx->group_count; i++)
    {
        int indent = 2;
        grp = &ctx->groups[i];

        if ((grp->flags & CARGO_GROUP_HIDE) || (grp->opt_count == 0))
        {
            continue;
        }

        // The group name is always set for normal groups.
        // The default group is simply "".
        is_default_group = (strlen(grp->name) == 0);

        if (!is_default_group)
        {
            indent = 2;
        }

        if (!is_default_group) cargo_aappendf(&str, "\n%s:", grp->title);
        if (grp->description) cargo_aappendf(&str, "\n");

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Note, we only show the "Positional arguments" and "Options"
        // titles for the default group. It becomes quite spammy otherwise.
        if (positional_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Positional arguments:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    1, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }

        if (cargo_aappendf(&str, "\n") < 0) goto fail;

        if (option_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Options:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    0, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }
    }

    if(ctx->epilog && strlen(ctx->epilog)
       && !(flags & CARGO_USAGE_HIDE_EPILOG))
    {
        if (flags & CARGO_USAGE_RAW_EPILOG)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->epilog) < 0) goto fail;
        }
        else
        {
            char *lb_epilog;
            if (!(lb_epilog = _cargo_linebreak(ctx, ctx->epilog, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_epilog);
            _cargo_free(lb_epilog);
        }
    }

    // TODO: Realloc the buffer to minimize size.

    ret = b;

fail:
    // A real failure!
    if (!ret)
    {
        _cargo_xfree(&b);
    }

    // Save the usage and destroy it on exit,
    // we want the user to be able to do things like this:
    // printf("%s\nYou're bad at typing!\n", cargo_get_usage(cargo, 0));
    // without leaking memory.
    _cargo_xfree(&ctx->usage);

    ctx->usage = ret;

    return ret;
}